

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

int Imf_3_3::(anonymous_namespace)::
    getStringListSize<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *stringList,size_t entries)

{
  bool bVar1;
  size_type sVar2;
  char *text;
  size_t sVar3;
  size_type in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t length;
  const_iterator i;
  int totalSize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  InputExc *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30 [3];
  int local_14;
  size_type local_10;
  
  local_14 = 0;
  if (in_RSI == 0) {
    local_14 = 4;
  }
  else {
    local_10 = in_RSI;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar2 != local_10) {
      text = (char *)__cxa_allocate_exception(0x48);
      Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffffc0,text);
      __cxa_throw(text,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
    }
  }
  local_30[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_ffffffffffffffb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (InputExc *)
         stringSize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                   ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x140810);
    local_14 = local_14 + (int)in_stack_ffffffffffffffc0;
    sVar3 = anon_unknown_3::getVariableLengthIntegerSize((uint64_t)in_stack_ffffffffffffffc0);
    local_14 = local_14 + (int)sVar3;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_30);
  }
  return local_14;
}

Assistant:

int
getStringListSize (const T& stringList, size_t entries = 0)
{
    int totalSize = 0;
    if (entries == 0)
    {
        totalSize += 4; // 4 bytes to store number of entries;
    }
    else
    {
        if (stringList.size () != entries)
        {
            throw IEX_NAMESPACE::InputExc (
                "Incorrect number of components stored in ID Manifest");
        }
    }
    for (typename T::const_iterator i = stringList.begin ();
         i != stringList.end ();
         ++i)
    {
        size_t length = stringSize (i);
        totalSize += length;
        // up to five bytes for variable length encoded size

        totalSize += getVariableLengthIntegerSize (length);
    }
    return totalSize;
}